

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

bool __thiscall CppUnit::Test::findTestPath(Test *this,Test *test,TestPath *testPath)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  uint local_38;
  int childIndex;
  int childCount;
  Test *mutableThis;
  TestPath *testPath_local;
  Test *test_local;
  Test *this_local;
  
  if (this == test) {
    (*testPath->_vptr_TestPath[3])(testPath,this);
    this_local._7_1_ = true;
  }
  else {
    iVar1 = (*this->_vptr_Test[4])();
    for (local_38 = 0; (int)local_38 < iVar1; local_38 = local_38 + 1) {
      iVar2 = (*this->_vptr_Test[5])(this,(ulong)local_38);
      uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x40))
                        ((long *)CONCAT44(extraout_var,iVar2),test,testPath);
      if ((uVar3 & 1) != 0) {
        (*testPath->_vptr_TestPath[5])(testPath,this,0);
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool 
Test::findTestPath( const Test *test,
                    TestPath &testPath ) const
{
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  if ( this == test )
  {
    testPath.add( mutableThis );
    return true;
  }

  int childCount = getChildTestCount();
  for ( int childIndex =0; childIndex < childCount; ++childIndex )
  {
    if ( getChildTestAt( childIndex )->findTestPath( test, testPath ) )
    {
      testPath.insert( mutableThis, 0 );
      return true;
    }
  }

  return false;
}